

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldValue
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  int64 iVar1;
  FieldDescriptor *pFVar2;
  Reflection *pRVar3;
  bool bVar4;
  CppType CVar5;
  Token *pTVar6;
  string *psVar7;
  LogMessage *other;
  long i;
  bool local_3a1;
  LogFinisher local_311;
  LogMessage local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  int local_198;
  undefined4 uStack_194;
  int64 int_value;
  string local_188;
  EnumValueDescriptor *local_168;
  EnumValueDescriptor *enum_value;
  EnumDescriptor *enum_type;
  string value_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  string value_8;
  uint64 value_7;
  undefined1 local_80 [8];
  string value_6;
  double value_5;
  double value_4;
  uint64 value_3;
  int64 value_2;
  uint64 value_1;
  int64 value;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  ParserImpl *this_local;
  
  value = (int64)field;
  field_local = (FieldDescriptor *)reflection;
  reflection_local = (Reflection *)message;
  message_local = (Message *)this;
  CVar5 = FieldDescriptor::cpp_type(field);
  switch(CVar5) {
  case CPPTYPE_INT32:
    bVar4 = ConsumeSignedInteger(this,(int64 *)&value_1,0x7fffffff);
    if (!bVar4) {
      this_local._7_1_ = 0;
      goto LAB_00b4932a;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
    if (bVar4) {
      (**(code **)(*(long *)field_local + 0x208))
                (field_local,reflection_local,value,value_1 & 0xffffffff);
    }
    else {
      (**(code **)(*(long *)field_local + 0xe8))
                (field_local,reflection_local,value,value_1 & 0xffffffff);
    }
    break;
  case CPPTYPE_INT64:
    bVar4 = ConsumeSignedInteger(this,(int64 *)&value_3,0x7fffffffffffffff);
    if (!bVar4) {
      this_local._7_1_ = 0;
      goto LAB_00b4932a;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
    if (bVar4) {
      (**(code **)(*(long *)field_local + 0x210))(field_local,reflection_local,value,value_3);
    }
    else {
      (**(code **)(*(long *)field_local + 0xf0))(field_local,reflection_local,value,value_3);
    }
    break;
  case CPPTYPE_UINT32:
    bVar4 = ConsumeUnsignedInteger(this,(uint64 *)&value_2,0xffffffff);
    if (!bVar4) {
      this_local._7_1_ = 0;
      goto LAB_00b4932a;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
    if (bVar4) {
      (**(code **)(*(long *)field_local + 0x218))
                (field_local,reflection_local,value,value_2 & 0xffffffff);
    }
    else {
      (**(code **)(*(long *)field_local + 0xf8))
                (field_local,reflection_local,value,value_2 & 0xffffffff);
    }
    break;
  case CPPTYPE_UINT64:
    bVar4 = ConsumeUnsignedInteger(this,(uint64 *)&value_4,0xffffffffffffffff);
    if (!bVar4) {
      this_local._7_1_ = 0;
      goto LAB_00b4932a;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
    if (bVar4) {
      (**(code **)(*(long *)field_local + 0x220))(field_local,reflection_local,value,value_4);
    }
    else {
      (**(code **)(*(long *)field_local + 0x100))(field_local,reflection_local,value,value_4);
    }
    break;
  case CPPTYPE_DOUBLE:
    bVar4 = ConsumeDouble(this,(double *)((long)&value_6.field_2 + 8));
    if (!bVar4) {
      this_local._7_1_ = 0;
      goto LAB_00b4932a;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
    if (bVar4) {
      (**(code **)(*(long *)field_local + 0x230))
                (value_6.field_2._8_8_,field_local,reflection_local,value);
    }
    else {
      (**(code **)(*(long *)field_local + 0x110))
                (value_6.field_2._8_8_,field_local,reflection_local,value);
    }
    break;
  case CPPTYPE_FLOAT:
    bVar4 = ConsumeDouble(this,&value_5);
    if (!bVar4) {
      this_local._7_1_ = 0;
      goto LAB_00b4932a;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
    pRVar3 = reflection_local;
    pFVar2 = field_local;
    iVar1 = value;
    if (bVar4) {
      io::SafeDoubleToFloat(value_5);
      (**(code **)(*(long *)pFVar2 + 0x228))(pFVar2,pRVar3,iVar1);
    }
    else {
      io::SafeDoubleToFloat(value_5);
      (**(code **)(*(long *)pFVar2 + 0x108))(pFVar2,pRVar3,iVar1);
    }
    break;
  case CPPTYPE_BOOL:
    bVar4 = LookingAtType(this,TYPE_INTEGER);
    if (bVar4) {
      bVar4 = ConsumeUnsignedInteger(this,(uint64 *)(value_8.field_2._M_local_buf + 8),1);
      if (!bVar4) {
        this_local._7_1_ = 0;
        goto LAB_00b4932a;
      }
      bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
      if (bVar4) {
        (**(code **)(*(long *)field_local + 0x238))
                  (field_local,reflection_local,value,value_8.field_2._8_8_ != 0);
      }
      else {
        (**(code **)(*(long *)field_local + 0x118))
                  (field_local,reflection_local,value,value_8.field_2._8_8_ != 0);
      }
    }
    else {
      std::__cxx11::string::string((string *)local_b8);
      bVar4 = ConsumeIdentifier(this,(string *)local_b8);
      if (bVar4) {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b8,"true");
        if (((bVar4) ||
            (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_b8,"True"), bVar4)) ||
           (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_b8,"t"), bVar4)) {
          bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
          if (bVar4) {
            (**(code **)(*(long *)field_local + 0x238))(field_local,reflection_local,value,1);
          }
          else {
            (**(code **)(*(long *)field_local + 0x118))(field_local,reflection_local,value,1);
          }
        }
        else {
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b8,"false");
          if (((!bVar4) &&
              (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_b8,"False"), !bVar4)) &&
             (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b8,"f"), !bVar4)) {
            psVar7 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)value);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&value_9.field_2 + 8),"Invalid value for boolean field \"",psVar7)
            ;
            std::operator+(&local_118,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&value_9.field_2 + 8),"\". Value: \"");
            std::operator+(&local_f8,&local_118,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b8);
            std::operator+(&local_d8,&local_f8,"\".");
            ReportError(this,&local_d8);
            std::__cxx11::string::~string((string *)&local_d8);
            std::__cxx11::string::~string((string *)&local_f8);
            std::__cxx11::string::~string((string *)&local_118);
            std::__cxx11::string::~string((string *)(value_9.field_2._M_local_buf + 8));
            this_local._7_1_ = 0;
            bVar4 = true;
            goto LAB_00b48c38;
          }
          bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
          if (bVar4) {
            (**(code **)(*(long *)field_local + 0x238))(field_local,reflection_local,value,0);
          }
          else {
            (**(code **)(*(long *)field_local + 0x118))(field_local,reflection_local,value,0);
          }
        }
        bVar4 = false;
      }
      else {
        this_local._7_1_ = 0;
        bVar4 = true;
      }
LAB_00b48c38:
      std::__cxx11::string::~string((string *)local_b8);
      if (bVar4) goto LAB_00b4932a;
    }
    break;
  case CPPTYPE_ENUM:
    std::__cxx11::string::string((string *)&enum_type);
    enum_value = (EnumValueDescriptor *)FieldDescriptor::enum_type((FieldDescriptor *)value);
    local_168 = (EnumValueDescriptor *)0x0;
    bVar4 = LookingAtType(this,TYPE_IDENTIFIER);
    if (bVar4) {
      bVar4 = ConsumeIdentifier(this,(string *)&enum_type);
      if (bVar4) {
        local_168 = EnumDescriptor::FindValueByName
                              ((EnumDescriptor *)enum_value,(string *)&enum_type);
LAB_00b48f5c:
        if (local_168 == (EnumValueDescriptor *)0x0) {
          if ((this->allow_unknown_enum_ & 1U) == 0) {
            std::operator+(&local_258,"Unknown enumeration value of \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &enum_type);
            std::operator+(&local_238,&local_258,"\" for field \"");
            psVar7 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)value);
            std::operator+(&local_218,&local_238,psVar7);
            std::operator+(&local_1f8,&local_218,"\".");
            ReportError(this,&local_1f8);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::__cxx11::string::~string((string *)&local_218);
            std::__cxx11::string::~string((string *)&local_238);
            std::__cxx11::string::~string((string *)&local_258);
            this_local._7_1_ = 0;
            value_7._0_4_ = 1;
          }
          else {
            std::operator+(&local_2d8,"Unknown enumeration value of \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &enum_type);
            std::operator+(&local_2b8,&local_2d8,"\" for field \"");
            psVar7 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)value);
            std::operator+(&local_298,&local_2b8,psVar7);
            std::operator+(&local_278,&local_298,"\".");
            ReportWarning(this,&local_278);
            std::__cxx11::string::~string((string *)&local_278);
            std::__cxx11::string::~string((string *)&local_298);
            std::__cxx11::string::~string((string *)&local_2b8);
            std::__cxx11::string::~string((string *)&local_2d8);
            this_local._7_1_ = 1;
            value_7._0_4_ = 1;
          }
        }
        else {
          bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
          if (bVar4) {
            (**(code **)(*(long *)field_local + 0x248))
                      (field_local,reflection_local,value,local_168);
          }
          else {
            (**(code **)(*(long *)field_local + 0x128))
                      (field_local,reflection_local,value,local_168);
          }
          value_7._0_4_ = 2;
        }
      }
      else {
        this_local._7_1_ = 0;
        value_7._0_4_ = 1;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_188,"-",(allocator *)((long)&int_value + 7));
      bVar4 = LookingAt(this,&local_188);
      local_3a1 = true;
      if (!bVar4) {
        local_3a1 = LookingAtType(this,TYPE_INTEGER);
      }
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator((allocator<char> *)((long)&int_value + 7));
      if (local_3a1 == false) {
        pTVar6 = io::Tokenizer::current(&this->tokenizer_);
        std::operator+(&local_1d8,"Expected integer or identifier, got: ",&pTVar6->text);
        ReportError(this,&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        this_local._7_1_ = 0;
        value_7._0_4_ = 1;
      }
      else {
        bVar4 = ConsumeSignedInteger(this,(int64 *)&local_198,0x7fffffff);
        if (bVar4) {
          SimpleItoa_abi_cxx11_(&local_1b8,(protobuf *)CONCAT44(uStack_194,local_198),i);
          std::__cxx11::string::operator=((string *)&enum_type,(string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1b8);
          local_168 = EnumDescriptor::FindValueByNumber((EnumDescriptor *)enum_value,local_198);
          goto LAB_00b48f5c;
        }
        this_local._7_1_ = 0;
        value_7._0_4_ = 1;
      }
    }
    std::__cxx11::string::~string((string *)&enum_type);
    goto joined_r0x00b48824;
  case CPPTYPE_STRING:
    std::__cxx11::string::string((string *)local_80);
    bVar4 = ConsumeString(this,(string *)local_80);
    if (bVar4) {
      bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
      if (bVar4) {
        (**(code **)(*(long *)field_local + 0x240))(field_local,reflection_local,value,local_80);
      }
      else {
        (**(code **)(*(long *)field_local + 0x120))(field_local,reflection_local,value,local_80);
      }
      value_7._0_4_ = 2;
    }
    else {
      this_local._7_1_ = 0;
      value_7._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_80);
joined_r0x00b48824:
    if ((int)value_7 == 1) goto LAB_00b4932a;
    break;
  case CPPTYPE_MESSAGE:
    internal::LogMessage::LogMessage
              (&local_310,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x2f4);
    other = internal::LogMessage::operator<<
                      (&local_310,"Reached an unintended state: CPPTYPE_MESSAGE");
    internal::LogFinisher::operator=(&local_311,other);
    internal::LogMessage::~LogMessage(&local_310);
  }
  this_local._7_1_ = 1;
LAB_00b4932a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ConsumeFieldValue(Message* message,
                         const Reflection* reflection,
                         const FieldDescriptor* field) {

// Define an easy to use macro for setting fields. This macro checks
// to see if the field is repeated (in which case we need to use the Add
// methods or not (in which case we need to use the Set methods).
#define SET_FIELD(CPPTYPE, VALUE)                                  \
        if (field->is_repeated()) {                                \
          reflection->Add##CPPTYPE(message, field, VALUE);         \
        } else {                                                   \
          reflection->Set##CPPTYPE(message, field, VALUE);         \
        }                                                          \

    switch(field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint32max));
        SET_FIELD(Int32, static_cast<int32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT32: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint32max));
        SET_FIELD(UInt32, static_cast<uint32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_INT64: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint64max));
        SET_FIELD(Int64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint64max));
        SET_FIELD(UInt64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_FLOAT: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Float, io::SafeDoubleToFloat(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_DOUBLE: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Double, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_STRING: {
        string value;
        DO(ConsumeString(&value));
        SET_FIELD(String, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_BOOL: {
        if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          uint64 value;
          DO(ConsumeUnsignedInteger(&value, 1));
          SET_FIELD(Bool, value);
        } else {
          string value;
          DO(ConsumeIdentifier(&value));
          if (value == "true" || value == "True" || value == "t") {
            SET_FIELD(Bool, true);
          } else if (value == "false" || value == "False" || value == "f") {
            SET_FIELD(Bool, false);
          } else {
            ReportError("Invalid value for boolean field \"" + field->name()
                        + "\". Value: \"" + value  + "\".");
            return false;
          }
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_ENUM: {
        string value;
        const EnumDescriptor* enum_type = field->enum_type();
        const EnumValueDescriptor* enum_value = NULL;

        if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
          DO(ConsumeIdentifier(&value));
          // Find the enumeration value.
          enum_value = enum_type->FindValueByName(value);

        } else if (LookingAt("-") ||
                   LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          int64 int_value;
          DO(ConsumeSignedInteger(&int_value, kint32max));
          value = SimpleItoa(int_value);        // for error reporting
          enum_value = enum_type->FindValueByNumber(int_value);
        } else {
          ReportError("Expected integer or identifier, got: " +
                      tokenizer_.current().text);
          return false;
        }

        if (enum_value == NULL) {
          if (!allow_unknown_enum_) {
            ReportError("Unknown enumeration value of \"" + value  + "\" for "
                        "field \"" + field->name() + "\".");
            return false;
          } else {
            ReportWarning("Unknown enumeration value of \"" + value  + "\" for "
                          "field \"" + field->name() + "\".");
            return true;
          }
        }

        SET_FIELD(Enum, enum_value);
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We should never get here. Put here instead of a default
        // so that if new types are added, we get a nice compiler warning.
        GOOGLE_LOG(FATAL) << "Reached an unintended state: CPPTYPE_MESSAGE";
        break;
      }
    }
#undef SET_FIELD
    return true;
  }